

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_int_noinline<char,fmt::v11::basic_appender<char>,unsigned_int>
          (basic_appender<char> out,write_int_arg<unsigned_int> arg,format_specs *specs)

{
  uint uVar1;
  char *pcVar2;
  basic_appender<char> bVar3;
  write_int_arg<unsigned_int> wVar4;
  long lVar5;
  uint uVar6;
  int num_digits;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  anon_class_24_4_0fb5e8cf local_78;
  size_padding sp;
  char buffer [32];
  char local_38 [8];
  
  uVar10 = (ulong)arg >> 0x20;
  uVar9 = (specs->super_basic_specs).data_;
  uVar1 = arg.abs_value;
  uVar8 = arg.prefix;
  pcVar2 = local_38;
  switch(uVar9 & 7) {
  case 4:
    pcVar2 = do_format_base2e<char,unsigned_int>
                       (4,buffer,uVar1,0x20,(bool)((byte)(uVar9 >> 0xc) & 1));
    uVar9 = (specs->super_basic_specs).data_;
    if ((uVar9 >> 0xd & 1) != 0) {
      uVar1 = (uint)((uVar9 >> 0xc & 1) == 0) << 0xd | 0x5830;
      uVar9 = uVar1 << 8;
      if (uVar10 == 0) {
        uVar9 = uVar1;
      }
      uVar10 = (ulong)((uVar9 | uVar8) + 0x2000000);
    }
    goto LAB_004734b6;
  case 5:
    lVar5 = 0;
    uVar7 = (ulong)arg & 0xffffffff;
    do {
      uVar6 = (uint)uVar7;
      pcVar2[-1] = (byte)uVar7 & 7 | 0x30;
      pcVar2 = pcVar2 + -1;
      uVar7 = uVar7 >> 3;
      lVar5 = lVar5 + 1;
    } while (7 < uVar6);
    if (((uVar9 >> 0xd & 1) == 0) || (uVar1 == 0 || lVar5 < specs->precision)) goto LAB_004734b6;
    uVar9 = 0x3000;
    if (uVar10 == 0) {
      uVar9 = 0x30;
    }
    uVar9 = (uVar9 | uVar8) + 0x1000000;
    break;
  case 6:
    wVar4 = (write_int_arg<unsigned_int>)((ulong)arg & 0xffffffff);
    do {
      uVar1 = arg.abs_value;
      pcVar2[-1] = (byte)arg.abs_value & 1 | 0x30;
      pcVar2 = pcVar2 + -1;
      arg = (write_int_arg<unsigned_int>)((ulong)wVar4 >> 1);
      wVar4 = arg;
    } while (1 < uVar1);
    if ((uVar9 >> 0xd & 1) == 0) goto LAB_004734b6;
    uVar1 = (uint)((uVar9 >> 0xc & 1) == 0) << 0xd | 0x4230;
    uVar9 = uVar1 << 8;
    if (uVar10 == 0) {
      uVar9 = uVar1;
    }
    uVar9 = (uVar9 | uVar8) + 0x2000000;
    break;
  case 7:
    bVar3 = write_char<char,fmt::v11::basic_appender<char>>(out,(char)arg.abs_value,specs);
    return (basic_appender<char>)bVar3.container;
  default:
    pcVar2 = do_format_decimal<char,unsigned_int>(buffer,uVar1,0x20);
    goto LAB_004734b6;
  }
  uVar10 = (ulong)uVar9;
LAB_004734b6:
  num_digits = (int)local_38 - (int)pcVar2;
  uVar9 = (uint)uVar10;
  if (specs->precision == -1 && specs->width == 0) {
    bVar3 = reserve<char>(out,(ulong)(uint)((int)(uVar10 >> 0x18) + num_digits));
    for (uVar9 = uVar9 & 0xffffff; uVar9 != 0; uVar9 = uVar9 >> 8) {
      local_78._0_8_ = bVar3;
      basic_appender<char>::operator=((basic_appender<char> *)&local_78,(char)uVar9);
    }
    buffer<char>::append<char>(bVar3.container,pcVar2,local_38);
  }
  else {
    size_padding::size_padding(&sp,num_digits,uVar9,specs);
    local_78.padding = sp.padding;
    local_78.prefix = uVar9;
    local_78.begin = pcVar2;
    local_78.end = local_38;
    bVar3 = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::write_int<char,fmt::v11::basic_appender<char>,unsigned_int>(fmt::v11::basic_appender<char>,fmt::v11::detail::write_int_arg<unsigned_int>,fmt::v11::format_specs_const&)::_lambda(fmt::v11::basic_appender<char>)_1_>
                      (out,specs,(ulong)sp.size,&local_78);
  }
  return (basic_appender<char>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(OutputIt out,
                                                   write_int_arg<T> arg,
                                                   const format_specs& specs)
    -> OutputIt {
  return write_int<Char>(out, arg, specs);
}